

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vector.cpp
# Opt level: O0

Reals __thiscall Omega_h::get_vector_norms_tmpl<2>(Omega_h *this,Reals *vs)

{
  int size_in;
  void *extraout_RDX;
  Reals RVar1;
  Write<double> local_b8;
  undefined1 local_a8 [8];
  type f;
  allocator local_71;
  string local_70 [32];
  undefined1 local_50 [8];
  Write<double> out;
  int n;
  Reals *vs_local;
  ulong local_10;
  
  if (((ulong)(vs->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((vs->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(vs->write_).shared_alloc_.alloc >> 3;
  }
  size_in = divide_no_remainder<int>((int)(local_10 >> 3),2);
  out.shared_alloc_.direct_ptr._4_4_ = size_in;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"",&local_71);
  Write<double>::Write((Write<double> *)local_50,size_in,(string *)local_70);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  Write<double>::Write((Write<double> *)local_a8,(Write<double> *)local_50);
  Read<double>::Read((Read<double> *)&f.out.shared_alloc_.direct_ptr,vs);
  parallel_for<Omega_h::get_vector_norms_tmpl<2>(Omega_h::Read<double>)::_lambda(int)_1_>
            (out.shared_alloc_.direct_ptr._4_4_,(type *)local_a8,"get_vector_norms");
  Write<double>::Write(&local_b8,(Write<signed_char> *)local_50);
  Read<double>::Read((Read<double> *)this,&local_b8);
  Write<double>::~Write(&local_b8);
  get_vector_norms_tmpl<2>(Omega_h::Read<double>)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)local_a8);
  Write<double>::~Write((Write<double> *)local_50);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals get_vector_norms_tmpl(Reals vs) {
  auto n = divide_no_remainder(vs.size(), dim);
  auto out = Write<Real>(n);
  auto f = OMEGA_H_LAMBDA(LO i) { out[i] = norm(get_vector<dim>(vs, i)); };
  parallel_for(n, f, "get_vector_norms");
  return out;
}